

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::ConvertToFullPath
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *localPath)

{
  string *a;
  char local_22 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *localPath_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  string *dir;
  
  local_22[1] = 0;
  local_20 = localPath;
  localPath_local = (string *)this;
  this_local = (cmLocalUnixMakefileGenerator3 *)__return_storage_ptr__;
  a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_22[0] = '/';
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
            (__return_storage_ptr__,a,local_22,local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::ConvertToFullPath(
  const std::string& localPath)
{
  std::string dir =
    cmStrCat(this->GetCurrentBinaryDirectory(), '/', localPath);
  return dir;
}